

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSpace::~IfcSpace(IfcSpace *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18;
  *(undefined8 *)
   &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18 = 0x8d8a08;
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8d8af8;
  this[-1].super_IfcSpatialStructureElement.CompositionType._M_dataplus._M_p = (pointer)0x8d8a30;
  this[-1].super_IfcSpatialStructureElement.CompositionType.field_2._M_allocated_capacity = 0x8d8a58
  ;
  *(undefined8 *)&this[-1].field_0x180 = 0x8d8a80;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0x8d8aa8;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x58 = 0x8d8ad0;
  puVar1 = *(undefined1 **)
            &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x68;
  puVar2 = &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x78;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcSpatialStructureElement::~IfcSpatialStructureElement
            ((IfcSpatialStructureElement *)this_00,&PTR_construction_vtable_24__008d8b10);
  operator_delete(this_00,0x1b0);
  return;
}

Assistant:

IfcSpace() : Object("IfcSpace") {}